

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManDumpStats(Gia_Man_t *pGia,Abs_Par_t *pPars,sat_solver2 *pSat,int iFrame,int fUseN)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  undefined4 in_register_0000000c;
  char *pcVar6;
  char *pcVar7;
  double dVar8;
  char pFileName [32];
  
  pcVar7 = "n";
  if (fUseN == 0) {
    pcVar7 = "";
  }
  pcVar6 = "p";
  if (pPars->fUseFullProof == 0) {
    pcVar6 = "";
  }
  sprintf(pFileName,"stats_gla%s%s.txt",pcVar7,pcVar6);
  __stream = fopen(pFileName,"a+");
  pcVar7 = pGia->pName;
  uVar4 = pGia->nRegs;
  iVar1 = pGia->vCis->nSize;
  iVar2 = pGia->vCos->nSize;
  iVar3 = pGia->nObjs;
  dVar8 = sat_solver2_memory_proof(pSat);
  fprintf(__stream,"%s pi=%d ff=%d and=%d mem=%d bmc=%d",pcVar7,(ulong)(iVar1 - uVar4),(ulong)uVar4,
          (ulong)(uint)(~(iVar1 + iVar2) + iVar3),
          (ulong)(uint)(int)(dVar8 * 9.5367431640625e-07 + 1.0),
          CONCAT44(in_register_0000000c,iFrame));
  if (pGia->vGateClasses != (Vec_Int_t *)0x0) {
    uVar4 = Gia_GlaCountFlops(pGia,pGia->vGateClasses);
    uVar5 = Gia_GlaCountNodes(pGia,pGia->vGateClasses);
    fprintf(__stream," ff=%d and=%d",(ulong)uVar4,(ulong)uVar5);
  }
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN )
{
    FILE * pFile;
    char pFileName[32];
    sprintf( pFileName, "stats_gla%s%s.txt", fUseN ? "n":"", pPars->fUseFullProof ? "p":"" ); 

    pFile = fopen( pFileName, "a+" );

    fprintf( pFile, "%s pi=%d ff=%d and=%d mem=%d bmc=%d", 
        pGia->pName, 
        Gia_ManPiNum(pGia), Gia_ManRegNum(pGia), Gia_ManAndNum(pGia), 
        (int)(1 + sat_solver2_memory_proof(pSat)/(1<<20)),
        iFrame );

    if ( pGia->vGateClasses )
    fprintf( pFile, " ff=%d and=%d",                 
        Gia_GlaCountFlops( pGia, pGia->vGateClasses ),
        Gia_GlaCountNodes( pGia, pGia->vGateClasses )  );

    fprintf( pFile, "\n" );
    fclose( pFile );
}